

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_md.c
# Opt level: O3

int gost_digest_copy(EVP_MD_CTX *to,EVP_MD_CTX *from)

{
  long lVar1;
  void *__dest;
  void *__src;
  
  lVar1 = EVP_MD_CTX_get0_md_data();
  if (lVar1 != 0) {
    lVar1 = EVP_MD_CTX_get0_md_data(from);
    if (lVar1 != 0) {
      __dest = (void *)EVP_MD_CTX_get0_md_data(to);
      __src = (void *)EVP_MD_CTX_get0_md_data(from);
      memcpy(__dest,__src,0x110);
    }
  }
  return 1;
}

Assistant:

static int gost_digest_copy(EVP_MD_CTX *to, const EVP_MD_CTX *from)
{
    struct ossl_gost_digest_ctx *md_ctx = EVP_MD_CTX_md_data(to);
    if (EVP_MD_CTX_md_data(to) && EVP_MD_CTX_md_data(from)) {
        memcpy(EVP_MD_CTX_md_data(to), EVP_MD_CTX_md_data(from),
               sizeof(struct ossl_gost_digest_ctx));
        md_ctx->dctx.cipher_ctx = &(md_ctx->cctx);
    }
    return 1;
}